

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::FragmentStamp::addConstraintStamp(FragmentStamp *this,ConstraintStamp *constraint)

{
  value_type *in_RDI;
  vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool FragmentStamp::addConstraintStamp(ConstraintStamp* constraint) {
    constraintStamps_.push_back(constraint);
    return true;
  }